

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnv_hash.c
# Opt level: O2

uint32_t fnv1_hash_data(void *data,size_t size)

{
  uint32_t hash;
  size_t sVar1;
  uint8_t *bytes;
  
  hash = 0x811c9dc5;
  for (sVar1 = 0; size != sVar1; sVar1 = sVar1 + 1) {
    hash = (hash ^ *(byte *)((long)data + sVar1)) * 0x1000193;
  }
  return hash;
}

Assistant:

uint32_t
fnv1_hash_data(const void *data, size_t size)
{
	uint32_t hash = 2166136261ul;
	const uint8_t *bytes = (uint8_t *)data;

	while (size-- != 0) {
		hash ^= *bytes;
		hash = hash * 0x01000193;
		bytes++;
	}

	return hash;
}